

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O2

toff_t MySeek(thandle_t opaque,toff_t offset,int whence)

{
  long lVar1;
  toff_t tVar2;
  undefined8 uStack_8;
  
  if (whence == 0) {
    lVar1 = 0;
  }
  else {
    if (whence == 1) {
      uStack_8 = 0x10;
    }
    else {
      uStack_8 = 8;
    }
    lVar1 = *(long *)((long)opaque + uStack_8);
  }
  tVar2 = lVar1 + offset;
  if (*(ulong *)((long)opaque + 8) < tVar2) {
    return 0xffffffffffffffff;
  }
  *(toff_t *)((long)opaque + 0x10) = tVar2;
  return tVar2;
}

Assistant:

static toff_t MySeek(thandle_t opaque, toff_t offset, int whence) {
  MyData* const my_data = (MyData*)opaque;
  offset += (whence == SEEK_CUR) ? my_data->pos
          : (whence == SEEK_SET) ? 0
          : my_data->size;
  if (offset > my_data->size) return (toff_t)-1;
  my_data->pos = offset;
  return offset;
}